

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qimage.h
# Opt level: O3

QImage * __thiscall QImage::convertToFormat(QImage *this,Format f,ImageConversionFlags flags)

{
  undefined8 uVar1;
  char cVar2;
  undefined4 in_ECX;
  undefined4 in_register_00000034;
  long lVar3;
  
  lVar3 = CONCAT44(in_register_00000034,f);
  cVar2 = QImage::convertToFormat_inplace
                    (lVar3,flags.super_QFlagsStorageHelper<Qt::ImageConversionFlag,_4>.
                           super_QFlagsStorage<Qt::ImageConversionFlag>.i,in_ECX);
  if (cVar2 == '\0') {
    QImage::convertToFormat_helper
              (this,lVar3,
               flags.super_QFlagsStorageHelper<Qt::ImageConversionFlag,_4>.
               super_QFlagsStorage<Qt::ImageConversionFlag>.i,in_ECX);
  }
  else {
    QPaintDevice::QPaintDevice((QPaintDevice *)this);
    *(code **)this = QtPrivateLogging::qLcEglfsKmsDebug;
    uVar1 = *(undefined8 *)(lVar3 + 0x10);
    *(undefined8 *)(lVar3 + 0x10) = 0;
    *(undefined8 *)(this + 0x10) = uVar1;
  }
  return this;
}

Assistant:

[[nodiscard]] QImage convertToFormat(Format f, Qt::ImageConversionFlags flags = Qt::AutoColor) &&
    {
        if (convertToFormat_inplace(f, flags))
            return std::move(*this);
        else
            return convertToFormat_helper(f, flags);
    }